

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  uint uVar1;
  ZSTD_format_e ZVar2;
  size_t sVar3;
  size_t sVar4;
  byte *pbVar5;
  XXH64_hash_t XVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint uVar9;
  byte *src_00;
  size_t err_code;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  byte *local_80;
  ulong local_78;
  
  if (ddict != (ZSTD_DDict *)0x0 && dict != (void *)0x0) {
    __assert_fail("dict==NULL || ddict==NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9f73,
                  "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                 );
  }
  if (ddict != (ZSTD_DDict *)0x0) {
    dict = ddict->dictContent;
    dictSize = ddict->dictSize;
  }
  ZVar2 = dctx->format;
  if (ZVar2 < 2) {
    bVar13 = false;
    local_80 = (byte *)dst;
    local_78 = dstCapacity;
    do {
      while( true ) {
        if (srcSize < (ulong)(ZVar2 == ZSTD_f_zstd1) * 4 + 1) {
          if (srcSize == 0) {
            return (long)local_80 - (long)dst;
          }
          return 0xffffffffffffffb8;
        }
        if ((srcSize < 4) || ((*src & 0xfffffff0) != 0x184d2a50)) break;
        if (srcSize < 8) {
          return 0xffffffffffffffb8;
        }
        if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
          return 0xfffffffffffffff2;
        }
        uVar10 = (ulong)*(uint *)((long)src + 4) + 8;
        if (srcSize < uVar10) {
          uVar10 = 0xffffffffffffffb8;
        }
        if (0xffffffffffffff88 < uVar10) {
          return uVar10;
        }
        bVar12 = srcSize < uVar10;
        srcSize = srcSize - uVar10;
        if (bVar12) {
          __assert_fail("skippableSize <= srcSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x9f99,
                        "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                       );
        }
        src = (void *)((long)src + uVar10);
      }
      if (ddict == (ZSTD_DDict *)0x0) {
        sVar4 = ZSTD_decompressBegin_usingDict(dctx,dict,dictSize);
        if (0xffffffffffffff88 < sVar4) {
          return sVar4;
        }
      }
      else {
        ZSTD_decompressBegin_usingDDict(dctx,ddict);
      }
      pbVar8 = (byte *)dctx->previousDstEnd;
      if (local_78 != 0 && pbVar8 != local_80) {
        dctx->dictEnd = pbVar8;
        dctx->virtualStart = local_80 + ((long)dctx->prefixStart - (long)pbVar8);
        dctx->prefixStart = local_80;
        dctx->previousDstEnd = local_80;
      }
      ZVar2 = dctx->format;
      if (srcSize < (ulong)(ZVar2 == ZSTD_f_zstd1) * 4 + 5) {
        return 0xffffffffffffffb8;
      }
      sVar3 = ZSTD_frameHeaderSize_internal(src,(ulong)(ZVar2 == ZSTD_f_zstd1) * 4 + 1,ZVar2);
      sVar4 = sVar3;
      if (0xffffffffffffff88 < sVar3) {
LAB_0017c5a0:
        sVar3 = 0xffffffffffffffb8;
        if (!bVar13) {
          sVar3 = sVar4;
        }
        if ((int)sVar4 != -10) {
          return sVar4;
        }
        return sVar3;
      }
      if (srcSize < sVar3 + 3) {
        return 0xffffffffffffffb8;
      }
      sVar4 = ZSTD_decodeFrameHeader(dctx,src,sVar3);
      if (0xffffffffffffff88 < sVar4) goto LAB_0017c5a0;
      pbVar5 = local_80 + local_78;
      src = (void *)((long)src + sVar3);
      srcSize = srcSize - sVar3;
      pbVar8 = local_80;
      do {
        if (srcSize < 3) {
          return 0xffffffffffffffb8;
        }
        uVar1 = *src;
        sVar4 = (size_t)(uint3)((uint3)*src >> 3);
        uVar9 = (ushort)((ushort)uVar1 >> 1) & 3;
        uVar10 = (ulong)uVar9;
        if ((uVar9 != 1) && (uVar10 = sVar4, uVar9 == 3)) {
          return 0xffffffffffffffec;
        }
        uVar11 = srcSize - 3;
        srcSize = uVar11 - uVar10;
        if (uVar11 < uVar10) {
          return 0xffffffffffffffb8;
        }
        src_00 = (byte *)((long)src + 3);
        pbVar7 = pbVar5;
        if (src_00 < pbVar5) {
          pbVar7 = src_00;
        }
        if (src_00 < pbVar8) {
          pbVar7 = pbVar5;
        }
        if (uVar9 == 2) {
          sVar4 = ZSTD_decompressBlock_internal
                            (dctx,pbVar8,(long)pbVar7 - (long)pbVar8,src_00,uVar10,1,not_streaming);
          if (0xffffffffffffff88 < sVar4) goto LAB_0017c5a0;
        }
        else if (uVar9 == 1) {
          if ((ulong)((long)pbVar7 - (long)pbVar8) < sVar4) {
            return 0xffffffffffffffba;
          }
          if (pbVar8 == (byte *)0x0) {
            if (7 < (uint3)*src) {
              return 0xffffffffffffffb6;
            }
LAB_0017c45b:
            sVar4 = 0;
          }
          else {
            memset(pbVar8,(uint)*src_00,sVar4);
          }
        }
        else {
          if ((ulong)((long)pbVar5 - (long)pbVar8) < uVar10) {
            return 0xffffffffffffffba;
          }
          if (pbVar8 == (byte *)0x0) {
            if (uVar10 != 0) {
              return 0xffffffffffffffb6;
            }
            goto LAB_0017c45b;
          }
          memmove(pbVar8,src_00,uVar10);
          sVar4 = uVar10;
        }
        if (dctx->validateChecksum != 0) {
          XXH_INLINE_XXH64_update(&dctx->xxhState,pbVar8,sVar4);
        }
        pbVar8 = pbVar8 + sVar4;
        src = src_00 + uVar10;
      } while (((ushort)uVar1 & 1) == 0);
      uVar10 = (dctx->fParams).frameContentSize;
      sVar4 = (long)pbVar8 - (long)local_80;
      if ((uVar10 != 0xffffffffffffffff) && (sVar4 != uVar10)) {
        return 0xffffffffffffffec;
      }
      if ((dctx->fParams).checksumFlag != 0) {
        if (srcSize < 4) {
          return 0xffffffffffffffea;
        }
        if ((dctx->forceIgnoreChecksum == ZSTD_d_validateChecksum) &&
           (XVar6 = XXH_INLINE_XXH64_digest(&dctx->xxhState), *src != (uint)XVar6)) {
          return 0xffffffffffffffea;
        }
        src = (void *)((long)src + 4);
        srcSize = srcSize - 4;
      }
      if (0xffffffffffffff88 < sVar4) goto LAB_0017c5a0;
      bVar13 = local_78 < sVar4;
      local_78 = local_78 - sVar4;
      if (bVar13) {
        __assert_fail("res <= dstCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9fb8,
                      "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                     );
      }
      local_80 = local_80 + sVar4;
      ZVar2 = dctx->format;
      bVar13 = true;
    } while (ZVar2 < 2);
  }
  __assert_fail("(format == ZSTD_f_zstd1) || (format == ZSTD_f_zstd1_magicless)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x9c36,"size_t ZSTD_startingInputLength(ZSTD_format_e)");
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_startingInputLength(dctx->format)) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <= dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        if (srcSize >= 4) {
            U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(5, "reading magic number %08X", (unsigned)magicNumber);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                /* skippable frame detected : skip it */
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize, "invalid skippable frame");
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue; /* check next frame */
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict), "");
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize), "");
        }
        ZSTD_checkContinuity(dctx, dst, dstCapacity);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "At least one frame successfully completed, "
                "but following bytes are garbage: "
                "it's more likely to be a srcSize error, "
                "specifying more input bytes than size of frame(s). "
                "Note: one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic bytes. "
                "But this is _much_ less likely than a srcSize field error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            if (res != 0)
                dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (size_t)((BYTE*)dst - (BYTE*)dststart);
}